

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *peVar5;
  int iVar6;
  ostream *poVar7;
  long *extraout_RDX;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_88;
  __shared_ptr<uv11::ConnectRequest,_(__gnu_cxx::_Lock_policy)2> local_78;
  shared_ptr<uv11::Tcp> tcp;
  shared_ptr<uv11::ConnectRequest> connectRequest;
  shared_ptr<uv11::GetAddrInfoRequest> addrRequest;
  sockaddr_in addr;
  
  std::make_shared<uv11::GetAddrInfoRequest>();
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  pcStack_90 = std::
               _Function_handler<void_(uv11::GetAddrInfoRequest_&,_std::error_code,_uv11::UvAddrInfoPtr),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:18:9)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(uv11::GetAddrInfoRequest_&,_std::error_code,_uv11::UvAddrInfoPtr),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:18:9)>
             ::_M_manager;
  uv11::getaddrinfo((Loop *)&uv11::default_loop,
                    addrRequest.
                    super___shared_ptr<uv11::GetAddrInfoRequest,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (function *)local_a8._M_pod_data,"www.google.com",(char *)0x0);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::make_shared<uv11::Tcp>();
  std::make_shared<uv11::ConnectRequest>();
  uv11::ip4_addr("216.58.208.46",0x50,&addr);
  peVar5 = tcp.super___shared_ptr<uv11::Tcp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<uv11::Tcp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<uv11::Tcp,_(__gnu_cxx::_Lock_policy)2> *)&local_88,
             &tcp.super___shared_ptr<uv11::Tcp,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<uv11::ConnectRequest,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,
             &connectRequest.super___shared_ptr<uv11::ConnectRequest,_(__gnu_cxx::_Lock_policy)2>);
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_a8._M_unused._M_object = operator_new(0x20);
  _Var4._M_pi = local_78._M_refcount._M_pi;
  peVar3 = local_78._M_ptr;
  uVar2 = local_88._8_8_;
  uVar1 = local_88._M_unused._0_8_;
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = (void *)0x0;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78._M_ptr = (element_type *)0x0;
  *(undefined8 *)local_a8._M_unused._0_8_ = uVar1;
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = uVar2;
  *(element_type **)((long)local_a8._M_unused._0_8_ + 0x10) = peVar3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_a8._M_unused._0_8_ + 0x18) =
       _Var4._M_pi;
  pcStack_90 = std::
               _Function_handler<void_(uv11::ConnectRequest_&,_std::error_code),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:70:9)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(uv11::ConnectRequest_&,_std::error_code),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:70:9)>
             ::_M_manager;
  iVar6 = uv11::tcp_connect(connectRequest.
                            super___shared_ptr<uv11::ConnectRequest,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,peVar5,(sockaddr *)&addr,(function *)local_a8._M_pod_data);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  main::$_1::~__1((__1 *)local_88._M_pod_data);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  pcStack_90 = std::
               _Function_handler<void_(uv11::Handle_&,_unsigned_long,_uv_buf_t_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:99:9)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(uv11::Handle_&,_unsigned_long,_uv_buf_t_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:99:9)>
             ::_M_manager;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<void_(uv11::Stream_&,_const_uv11::Buffer_&,_long,_std::error_code),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:103:9)>
       ::_M_invoke;
  local_78._M_ptr =
       (element_type *)
       std::
       _Function_handler<void_(uv11::Stream_&,_const_uv11::Buffer_&,_long,_std::error_code),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/erikjohnston[P]uv11/src/main.cpp:103:9)>
       ::_M_manager;
  uv11::read_start((Stream *)tcp.super___shared_ptr<uv11::Tcp,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (function *)local_a8._M_pod_data,(function *)local_88._M_pod_data);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  if (iVar6 != 0) {
    (**(code **)(*extraout_RDX + 0x20))(&local_a8,extraout_RDX,iVar6);
    poVar7 = std::operator<<((ostream *)&std::cout,(string *)local_a8._M_pod_data);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::~string((string *)local_a8._M_pod_data);
  }
  iVar6 = uv11::run((Loop *)&uv11::default_loop,UV_RUN_DEFAULT);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&connectRequest.super___shared_ptr<uv11::ConnectRequest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tcp.super___shared_ptr<uv11::Tcp,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&addrRequest.super___shared_ptr<uv11::GetAddrInfoRequest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return iVar6;
}

Assistant:

int main() {

    auto addrRequest = std::make_shared<uv11::GetAddrInfoRequest>();
    uv11::getaddrinfo(
        uv11::default_loop,
        *addrRequest,
        [] (uv11::GetAddrInfoRequest&, uv11::Error e, uv11::UvAddrInfoPtr res) {
            if (e) {
                std::cout << "Addr info error: " << e.message() << std::endl;
            } else {
                std::string ip;
                addrinfo& a = *res;
                while (true) {
                    void * in_addr;
                    if (a.ai_family == AF_INET) {
                        in_addr = &reinterpret_cast<sockaddr_in*>(a.ai_addr)->sin_addr;
                    } else if (a.ai_family == AF_INET6) {
                        in_addr = &reinterpret_cast<sockaddr_in6*>(a.ai_addr)->sin6_addr;
                    } else {
                        std::cout << "unrecognized family " << a.ai_family << std::endl;
                        break;
                    }

                    auto err = uv11::inet_ntop(
                        a.ai_family,
                        &reinterpret_cast<sockaddr_in*>(a.ai_addr)->sin_addr,
                        ip
                    );

                    if (err) {
                        std::cout << "Failed to parse " << err.message() << std::endl;
                        break;
                    }

                    auto p = ::getprotobynumber(a.ai_protocol);
                    std::cout << ((a.ai_family == AF_INET) ? "IPv4" : "IPv6") << " " << ip << " " << p->p_name<< std::endl;

                    if (a.ai_next) {
                        a = *a.ai_next;
                        continue;
                    } else {
                        break;
                    }
                }
            }
        },
        "www.google.com", nullptr
    );

    sockaddr_in addr;

    auto tcp = std::make_shared<uv11::Tcp>();
    auto connectRequest = std::make_shared<uv11::ConnectRequest>();

    uv11::ip4_addr("216.58.208.46", 80, addr);

    auto e = uv11::tcp_connect(
        *connectRequest, *tcp, reinterpret_cast<sockaddr&>(addr),
        [tcp, connectRequest] (uv11::ConnectRequest&, uv11::Error e) {
            std::cout << "Connected!" << std::endl;
            if (e) {
                std::cout << e.message() << std::endl;
            }

            auto write_req = std::make_shared<uv11::WriteRequest>();

            char temp[] =  "GET / HTTP/1.1\r\nContent-Length: 0\r\nConnection: Close\r\n\r\n";
            auto get_request = std::make_shared<std::vector<char>>(
                std::begin(temp), std::end(temp)
            );

            uv11::write(
                *write_req,
                *tcp,
                uv11::make_buffer(*get_request),
                [tcp, write_req, get_request] (uv11::WriteRequest&, uv11::Error e) {
                    std::cout << "written" << std::endl;
                    if (e) {
                        std::cout << "Write error: " << e.message() << std::endl;
                    }
                }
            );
        }
    );

    uv11::read_start(
        *tcp,
        [] (uv11::Handle&, std::size_t suggested_size, uv11::uv_buf_t* buf) {
            buf->base = new char[suggested_size];
            buf->len = suggested_size;
        },
        [](uv11::Stream&, uv11::Buffer const& buf, ::ssize_t nread, uv11::Error e) {
            if (e) {
                std::cout << "Read error: " << e.message() << std::endl;
            } else {
                std::cout.write(buf.base, nread);
                std::cout << std::endl;
            }

            delete[] buf.base;
        });

    if (e) {
        std::cout << e.message() << std::endl;
    }

    return uv11::run(uv11::default_loop, uv11::RunMode::UV_RUN_DEFAULT);
}